

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

int coda_type_complex_set_type(coda_type_special *type,coda_type *element_type)

{
  coda_format format;
  coda_format cVar1;
  coda_type_record *pcVar2;
  coda_type_record_field *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (type->base_type == (coda_type *)0x0) {
    if ((element_type->type_class & ~coda_array_class) == coda_integer_class) {
      format = type->format;
      cVar1 = element_type->format;
      if (format == cVar1) {
        pcVar2 = coda_type_record_new(format);
        type->base_type = (coda_type *)pcVar2;
        pcVar3 = coda_type_record_field_new("real");
        coda_type_record_field_set_type(pcVar3,element_type);
        coda_type_record_add_field((coda_type_record *)type->base_type,pcVar3);
        pcVar3 = coda_type_record_field_new("imaginary");
        coda_type_record_field_set_type(pcVar3,element_type);
        coda_type_record_add_field((coda_type_record *)type->base_type,pcVar3);
        type->bit_size = type->base_type->bit_size;
        return 0;
      }
      pcVar4 = "unknown";
      pcVar5 = "unknown";
      if (cVar1 < (coda_format_rinex|coda_format_xml)) {
        pcVar5 = *(char **)(&DAT_001d7a00 + (ulong)cVar1 * 8);
      }
      if (format < (coda_format_rinex|coda_format_xml)) {
        pcVar4 = *(char **)(&DAT_001d7a00 + (ulong)format * 8);
      }
      coda_set_error(-400,"cannot use element type with %s format for complex type with %s format",
                     pcVar5,pcVar4);
    }
    else {
      if ((ulong)type->type_class < 7) {
        pcVar5 = *(char **)(&DAT_001d79c8 + (ulong)type->type_class * 8);
      }
      else {
        pcVar5 = "unknown";
      }
      coda_set_error(-400,"invalid type class (%s) for element type of complex type",pcVar5);
    }
  }
  else {
    coda_set_error(-400,"complex type already has an element type");
  }
  return -1;
}

Assistant:

int coda_type_complex_set_type(coda_type_special *type, coda_type *element_type)
{
    coda_type_record_field *field;

    if (type->base_type != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "complex type already has an element type");
        return -1;
    }
    if (element_type->type_class != coda_integer_class && element_type->type_class != coda_real_class)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid type class (%s) for element type of complex type",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (type->format != element_type->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "cannot use element type with %s format for complex type with %s format",
                       coda_type_get_format_name(element_type->format), coda_type_get_format_name(type->format));
        return -1;
    }

    type->base_type = (coda_type *)coda_type_record_new(type->format);
    field = coda_type_record_field_new("real");
    coda_type_record_field_set_type(field, element_type);
    coda_type_record_add_field((coda_type_record *)type->base_type, field);
    field = coda_type_record_field_new("imaginary");
    coda_type_record_field_set_type(field, element_type);
    coda_type_record_add_field((coda_type_record *)type->base_type, field);

    /* set bit_size */
    type->bit_size = type->base_type->bit_size;

    return 0;
}